

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O3

ir_visitor_status __thiscall
anon_unknown.dwarf_7ab89::lower_ubo_reference_visitor::visit_enter
          (lower_ubo_reference_visitor *this,ir_call *ir)

{
  byte bVar1;
  ir_node_type iVar2;
  uint uVar3;
  ir_intrinsic_id iVar4;
  ir_function_signature *piVar5;
  ir_instruction *piVar6;
  glsl_interface_packing packing;
  uint uVar7;
  int iVar8;
  glsl_interface_packing gVar9;
  ir_visitor_status iVar10;
  long lVar11;
  undefined4 extraout_var;
  void *pvVar12;
  operand b;
  ir_expression *piVar13;
  undefined4 extraout_var_00;
  ir_variable *piVar14;
  glsl_type *type;
  ir_function_signature *this_00;
  ir_function *this_01;
  undefined4 extraout_var_01;
  ir_call *this_02;
  uint uVar15;
  exec_node *node_2;
  exec_node *peVar16;
  exec_node *peVar17;
  exec_node *peVar18;
  exec_node *node;
  ir_rvalue *piVar19;
  exec_node **ppeVar20;
  bool row_major;
  void *local_f0;
  uint const_offset;
  ir_rvalue *local_e0;
  exec_list sig_params;
  exec_list local_a8;
  glsl_type *matrix_type;
  ir_rvalue *offset;
  char func_name [64];
  
  peVar18 = (ir->actual_parameters).head_sentinel.next;
  uVar15 = 0xffffffff;
  peVar17 = peVar18;
  do {
    peVar17 = peVar17->next;
    uVar15 = uVar15 + 1;
  } while (peVar17 != (exec_node *)0x0);
  if (1 < uVar15) {
    uVar15 = 0xffffffff;
    peVar17 = peVar18;
    do {
      peVar17 = peVar17->next;
      uVar15 = uVar15 + 1;
    } while (peVar17 != (exec_node *)0x0);
    if (uVar15 < 4) {
      peVar17 = &(ir->actual_parameters).tail_sentinel;
      peVar16 = (exec_node *)0x0;
      if (peVar18 != peVar17) {
        peVar16 = peVar18;
      }
      if ((((*(uint *)&peVar16[1].next < 7) &&
           (lVar11 = (*(code *)peVar16[-1].prev[4].next)(&peVar16[-1].prev), lVar11 != 0)) &&
          ((*(uint *)(lVar11 + 0x40) & 0xf000) == 0x2000)) &&
         ((*(long *)(lVar11 + 0x88) != 0 &&
          (ir->callee->intrinsic_id - ir_intrinsic_generic_atomic_add < 8)))) {
        peVar18 = (ir->actual_parameters).head_sentinel.next;
        uVar15 = 0xffffffff;
        peVar16 = peVar18;
        do {
          peVar16 = peVar16->next;
          uVar15 = uVar15 + 1;
        } while (peVar16 != (exec_node *)0x0);
        if ((uVar15 & 0xfffffffe) != 2) {
          __assert_fail("param_count == 2 || param_count == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                        ,0x3c2,
                        "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                       );
        }
        peVar16 = (exec_node *)0x0;
        if (peVar18 != peVar17) {
          peVar16 = peVar18;
        }
        piVar19 = (ir_rvalue *)&peVar16[-1].prev;
        if (peVar16 == (exec_node *)0x0) {
          piVar19 = (ir_rvalue *)0x0;
        }
        iVar2 = (piVar19->super_ir_instruction).ir_type;
        if ((ir_type_dereference_variable < iVar2) && (iVar2 != ir_type_swizzle)) {
          __assert_fail("inst->ir_type == ir_type_dereference_variable || inst->ir_type == ir_type_dereference_array || inst->ir_type == ir_type_dereference_record || inst->ir_type == ir_type_swizzle"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                        ,0x3ca,
                        "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                       );
        }
        if (piVar19->type->vector_elements == '\x01') {
          uVar3 = *(uint *)&piVar19->type->field_0x4;
          uVar7 = uVar3 & 0xfe;
          if ((uVar7 < 0xe) && ((uVar3 & 0xff) == 2 || uVar7 == 0)) {
            iVar8 = (*(piVar19->super_ir_instruction)._vptr_ir_instruction[8])(piVar19);
            piVar14 = (ir_variable *)CONCAT44(extraout_var,iVar8);
            if (piVar14 == (ir_variable *)0x0) {
              __assert_fail("var",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,0x3d1,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            pvVar12 = ralloc_parent(this->shader->ir);
            offset = (ir_rvalue *)0x0;
            bVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                    super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x31;
            gVar9 = *(uint *)&piVar14->interface_type->field_0x4 >> 0x16 &
                    GLSL_INTERFACE_PACKING_STD430;
            packing = (uint)bVar1 + (uint)bVar1 * 2;
            if (gVar9 == GLSL_INTERFACE_PACKING_STD430) {
              packing = gVar9;
            }
            if (gVar9 == GLSL_INTERFACE_PACKING_STD140) {
              packing = gVar9;
            }
            *(undefined4 *)
             &(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
              super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 = 4;
            this->variable = piVar14;
            local_e0 = piVar19;
            setup_for_load_or_store
                      (this,pvVar12,piVar14,piVar19,&offset,&const_offset,&row_major,&matrix_type,
                       packing);
            piVar19 = offset;
            if (offset == (ir_rvalue *)0x0) {
              __assert_fail("offset",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,1000,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            if (row_major == true) {
              __assert_fail("!row_major",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,0x3e9,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            if (matrix_type != (glsl_type *)0x0) {
              __assert_fail("matrix_type == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,0x3ea,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            b.val = (ir_rvalue *)exec_node::operator_new(0xb0,pvVar12);
            ir_constant::ir_constant((ir_constant *)b.val,const_offset,1);
            piVar13 = ir_builder::add((operand)piVar19,b);
            iVar8 = (*(this->uniform_block->super_ir_instruction)._vptr_ir_instruction[4])
                              (this->uniform_block,pvVar12,0);
            sig_params.head_sentinel.next = &sig_params.tail_sentinel;
            sig_params.head_sentinel.prev = (exec_node *)0x0;
            sig_params.tail_sentinel.next = (exec_node *)0x0;
            sig_params.tail_sentinel.prev = &sig_params.head_sentinel;
            local_f0 = pvVar12;
            piVar14 = (ir_variable *)exec_node::operator_new(0x90,pvVar12);
            ir_variable::ir_variable(piVar14,&glsl_type::_uint_type,"block_ref",ir_var_function_in);
            peVar18 = &(piVar14->super_ir_instruction).super_exec_node;
            (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
            (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
            (sig_params.tail_sentinel.prev)->next = peVar18;
            sig_params.tail_sentinel.prev = peVar18;
            piVar14 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
            ir_variable::ir_variable(piVar14,&glsl_type::_uint_type,"offset",ir_var_function_in);
            peVar18 = &(piVar14->super_ir_instruction).super_exec_node;
            (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
            (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
            (sig_params.tail_sentinel.prev)->next = peVar18;
            sig_params.tail_sentinel.prev = peVar18;
            type = glsl_type::get_scalar_type(local_e0->type);
            piVar14 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
            ir_variable::ir_variable(piVar14,type,"data1",ir_var_function_in);
            pvVar12 = local_f0;
            peVar18 = &(piVar14->super_ir_instruction).super_exec_node;
            (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
            (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
            (sig_params.tail_sentinel.prev)->next = peVar18;
            sig_params.tail_sentinel.prev = peVar18;
            if (uVar15 == 3) {
              piVar14 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
              ir_variable::ir_variable(piVar14,type,"data2",ir_var_function_in);
              peVar18 = &(piVar14->super_ir_instruction).super_exec_node;
              (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
              (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
              (sig_params.tail_sentinel.prev)->next = peVar18;
              sig_params.tail_sentinel.prev = peVar18;
            }
            this_00 = (ir_function_signature *)exec_node::operator_new(0x88,pvVar12);
            ir_function_signature::ir_function_signature
                      (this_00,local_e0->type,shader_storage_buffer_object);
            ir_function_signature::replace_parameters(this_00,&sig_params);
            piVar5 = ir->callee;
            iVar4 = piVar5->intrinsic_id;
            if ((int)iVar4 < 1) {
              __assert_fail("ir->callee->intrinsic_id >= ir_intrinsic_generic_load",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,0x40d,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            if (ir_intrinsic_generic_atomic_comp_swap < iVar4) {
              __assert_fail("ir->callee->intrinsic_id <= ir_intrinsic_generic_atomic_comp_swap",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                            ,0x40e,
                            "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                           );
            }
            this_00->intrinsic_id = iVar4 + ir_intrinsic_image_atomic_dec_wrap;
            sprintf(func_name,"%s_ssbo",piVar5->_function->name);
            this_01 = (ir_function *)exec_node::operator_new(0x60,local_f0);
            ir_function::ir_function(this_01,func_name);
            pvVar12 = local_f0;
            this_00->_function = this_01;
            peVar17 = &(this_00->super_ir_instruction).super_exec_node;
            (this_00->super_ir_instruction).super_exec_node.next =
                 &(this_01->signatures).tail_sentinel;
            peVar18 = (this_01->signatures).tail_sentinel.prev;
            (this_00->super_ir_instruction).super_exec_node.prev = peVar18;
            peVar18->next = peVar17;
            (this_01->signatures).tail_sentinel.prev = peVar17;
            local_a8.head_sentinel.next = (exec_node *)(CONCAT44(extraout_var_00,iVar8) + 8);
            if (CONCAT44(extraout_var_00,iVar8) == 0) {
              local_a8.head_sentinel.next = (exec_node *)0x0;
            }
            local_a8.head_sentinel.prev = (exec_node *)0x0;
            local_a8.tail_sentinel.next = (exec_node *)0x0;
            (local_a8.head_sentinel.next)->prev = &local_a8.head_sentinel;
            local_a8.tail_sentinel.prev =
                 &(piVar13->super_ir_rvalue).super_ir_instruction.super_exec_node;
            if (piVar13 == (ir_expression *)0x0) {
              local_a8.tail_sentinel.prev = (exec_node *)0x0;
            }
            (local_a8.tail_sentinel.prev)->next = &local_a8.tail_sentinel;
            (local_a8.tail_sentinel.prev)->prev = local_a8.head_sentinel.next;
            (local_a8.head_sentinel.next)->next = local_a8.tail_sentinel.prev;
            peVar18 = ((ir->actual_parameters).head_sentinel.next)->next;
            ppeVar20 = &peVar18[-1].prev;
            if (6 < *(uint *)&peVar18[1].next) {
              ppeVar20 = (exec_node **)0x0;
            }
            lVar11 = (*(code *)(*ppeVar20)[2].next)(ppeVar20,local_f0,0);
            peVar17 = (exec_node *)(lVar11 + 8);
            if (lVar11 == 0) {
              peVar17 = (exec_node *)0x0;
            }
            peVar17->next = &local_a8.tail_sentinel;
            peVar17->prev = local_a8.tail_sentinel.prev;
            (local_a8.tail_sentinel.prev)->next = peVar17;
            local_a8.tail_sentinel.prev = peVar17;
            if (uVar15 == 3) {
              ppeVar20 = &peVar18->next[-1].prev;
              if (6 < *(uint *)&peVar18->next[1].next) {
                ppeVar20 = (exec_node **)0x0;
              }
              lVar11 = (*(code *)(*ppeVar20)[2].next)(ppeVar20,pvVar12,0);
              peVar18 = (exec_node *)(lVar11 + 8);
              if (lVar11 == 0) {
                peVar18 = (exec_node *)0x0;
              }
              peVar18->next = &local_a8.tail_sentinel;
              peVar18->prev = local_a8.tail_sentinel.prev;
              (local_a8.tail_sentinel.prev)->next = peVar18;
              local_a8.tail_sentinel.prev = peVar18;
            }
            iVar8 = (*(ir->return_deref->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                      _vptr_ir_instruction[4])(ir->return_deref,pvVar12,0);
            this_02 = (ir_call *)exec_node::operator_new(0x60,pvVar12);
            ir_call::ir_call(this_02,this_00,
                             (ir_dereference_variable *)CONCAT44(extraout_var_01,iVar8),&local_a8);
            if (this_02 != ir) {
              this->progress = true;
              piVar6 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                       super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
              peVar17 = &(this_02->super_ir_instruction).super_exec_node;
              peVar18 = (piVar6->super_exec_node).prev;
              (this_02->super_ir_instruction).super_exec_node.prev = peVar18;
              (this_02->super_ir_instruction).super_exec_node.next = (piVar6->super_exec_node).next;
              peVar18->next = peVar17;
              ((piVar6->super_exec_node).next)->prev = peVar17;
              return visit_continue_with_parent;
            }
            goto LAB_00179cef;
          }
        }
        __assert_fail("deref->type->is_scalar() && (deref->type->is_integer_32() || deref->type->is_float())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                      ,0x3ce,
                      "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                     );
      }
    }
  }
LAB_00179cef:
  iVar10 = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  return iVar10;
}

Assistant:

ir_visitor_status
lower_ubo_reference_visitor::visit_enter(ir_call *ir)
{
   ir_call *new_ir = check_for_ssbo_atomic_intrinsic(ir);
   if (new_ir != ir) {
      progress = true;
      base_ir->replace_with(new_ir);
      return visit_continue_with_parent;
   }

   return rvalue_visit(ir);
}